

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

void __thiscall Container::kill_all(Container *this)

{
  int iVar1;
  __pid_t _Var2;
  int *piVar3;
  ContextManager *pCVar4;
  int status;
  string local_40;
  
  stop_timer();
  iVar1 = kill(-1,9);
  if (iVar1 != 0) {
    piVar3 = __errno_location();
    if (*piVar3 != 3) {
      pCVar4 = ContextManager::get();
      format_abi_cxx11_(&local_40,"Failed to kill all processes in box: %m");
      (**pCVar4->_vptr_ContextManager)(pCVar4,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  set_standard_handler_restart(0xe,true);
  while( true ) {
    do {
      _Var2 = wait(&status);
    } while (-1 < _Var2);
    piVar3 = __errno_location();
    if (*piVar3 == 10) break;
    pCVar4 = ContextManager::get();
    format_abi_cxx11_(&local_40,"kill_all() wait() failed: %m");
    (**pCVar4->_vptr_ContextManager)(pCVar4);
    std::__cxx11::string::~string((string *)&local_40);
  }
  set_standard_handler_restart(0xe,false);
  return;
}

Assistant:

void Container::kill_all() {
    stop_timer();
    if (kill(-1, SIGKILL) != 0 && errno != ESRCH) {
        die(format("Failed to kill all processes in box: %m"));
    }
    set_standard_handler_restart(SIGALRM, true);
    while (true) {
        int status;
        pid_t pid = wait(&status);
        if (pid < 0) {
            if (errno == ECHILD) {
                break;
            }
            die(format("kill_all() wait() failed: %m"));
        }
    }
    set_standard_handler_restart(SIGALRM, false);
}